

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApiDebug.cpp
# Opt level: O2

bool __thiscall triangle::contains(triangle *this,vec2 *p,float r)

{
  bool bVar1;
  uint uVar2;
  float fVar3;
  vec2 local_40;
  float local_38;
  
  bVar1 = contains(this,p);
  uVar2 = 0;
  while ((uVar2 < 0x100 && (bVar1 == false))) {
    fVar3 = ((float)(int)uVar2 * 0.00390625 + (float)(int)uVar2 * 0.00390625) * 3.1415927;
    local_38 = cosf(fVar3);
    fVar3 = sinf(fVar3);
    local_40.y = (*p).y + fVar3 * r;
    local_40.x = (*p).x + local_38 * r;
    bVar1 = contains(this,&local_40);
    uVar2 = uVar2 + 1;
  }
  return bVar1;
}

Assistant:

bool contains(const dja::vec2 &p, float r) const {
        bool res = contains(p);
        int cnt = 256;

        for (int i = 0; i < cnt && !res; ++i) {
            float u = i / float(cnt);
            float a = u * 2 * M_PI;
            float x = cos(a), y = sin(a);

            res = res || contains(p + r * dja::vec2(x, y));
        }

        return res;
    }